

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b780::Binary_DecodeUvarIntFromBinary_Test::TestBody
          (Binary_DecodeUvarIntFromBinary_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_4d8;
  Message local_4d0;
  int local_4c4;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_15;
  Message local_4a8;
  uint local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_14;
  allocator<unsigned_char> local_473;
  uchar local_472 [10];
  iterator local_468;
  size_type local_460;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  tuple<unsigned_int,_int> local_440;
  AssertHelper local_438;
  Message local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_13;
  Message local_408;
  uint local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3d8;
  tuple<unsigned_int,_int> local_3c0;
  AssertHelper local_3b8;
  Message local_3b0;
  int local_3a4;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_11;
  Message local_388;
  int local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_10;
  allocator<unsigned_char> local_355;
  uchar local_354 [4];
  iterator local_350;
  size_type local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_340;
  tuple<unsigned_int,_int> local_328;
  AssertHelper local_320;
  Message local_318;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_9;
  Message local_2f0;
  int local_2e4;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_8;
  allocator<unsigned_char> local_2bc;
  uchar local_2bb [3];
  iterator local_2b8;
  size_type local_2b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  tuple<unsigned_int,_int> local_290;
  AssertHelper local_288;
  Message local_280;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_7;
  Message local_258;
  int local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_6;
  allocator<unsigned_char> local_224;
  uchar local_223 [3];
  iterator local_220;
  size_type local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_210;
  tuple<unsigned_int,_int> local_1f8;
  AssertHelper local_1f0;
  Message local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_5;
  Message local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  allocator<unsigned_char> local_18c;
  uchar local_18b [3];
  iterator local_188;
  size_type local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  tuple<unsigned_int,_int> local_160;
  AssertHelper local_158;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_3;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  allocator<unsigned_char> local_f4;
  uchar local_f3 [3];
  iterator local_f0;
  size_type local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  tuple<unsigned_int,_int> local_c8;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  allocator<unsigned_char> local_4a;
  uchar local_49;
  iterator local_48;
  size_type local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  tuple<unsigned_int,_int> local_20;
  int local_18 [2];
  int count;
  UInt val;
  Binary_DecodeUvarIntFromBinary_Test *this_local;
  
  local_18[1] = 0;
  local_18[0] = 0;
  local_49 = '\x01';
  local_48 = &local_49;
  local_40 = 1;
  _count = this;
  std::allocator<unsigned_char>::allocator(&local_4a);
  __l_05._M_len = local_40;
  __l_05._M_array = local_48;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_38,__l_05,&local_4a);
  binary::binUvarint((binary *)&local_20,&local_38);
  std::tie<unsigned_int,int>((uint *)&gtest_ar.message_,local_18 + 1);
  std::tuple<unsigned_int&,int&>::operator=
            ((tuple<unsigned_int&,int&> *)&gtest_ar.message_,&local_20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  std::allocator<unsigned_char>::~allocator(&local_4a);
  local_84 = 1;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_80,"1","val",&local_84,(uint *)(local_18 + 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_ac = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_a8,"1","count",&local_ac,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_f3[0] = '\x11';
  local_f3[1] = 0x12;
  local_f3[2] = 0x13;
  local_f0 = local_f3;
  local_e8 = 3;
  std::allocator<unsigned_char>::allocator(&local_f4);
  __l_04._M_len = local_e8;
  __l_04._M_array = local_f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,__l_04,&local_f4);
  binary::binUvarint((binary *)&local_c8,&local_e0);
  std::tie<unsigned_int,int>((uint *)&gtest_ar_2.message_,local_18 + 1);
  std::tuple<unsigned_int&,int&>::operator=
            ((tuple<unsigned_int&,int&> *)&gtest_ar_2.message_,&local_c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e0);
  std::allocator<unsigned_char>::~allocator(&local_f4);
  local_11c = 0x11;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_118,"0x11","val",&local_11c,(uint *)(local_18 + 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_144 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_140,"1","count",&local_144,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_18b[0] = 0x80;
  local_18b[1] = 1;
  local_18b[2] = 7;
  local_188 = local_18b;
  local_180 = 3;
  std::allocator<unsigned_char>::allocator(&local_18c);
  __l_03._M_len = local_180;
  __l_03._M_array = local_188;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_178,__l_03,&local_18c);
  binary::binUvarint((binary *)&local_160,&local_178);
  std::tie<unsigned_int,int>((uint *)&gtest_ar_4.message_,local_18 + 1);
  std::tuple<unsigned_int&,int&>::operator=
            ((tuple<unsigned_int&,int&> *)&gtest_ar_4.message_,&local_160);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_178);
  std::allocator<unsigned_char>::~allocator(&local_18c);
  local_1b4 = 0x80;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_1b0,"128","val",&local_1b4,(uint *)(local_18 + 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1dc = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1d8,"2","count",&local_1dc,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_223[0] = 0xff;
  local_223[1] = 1;
  local_223[2] = 7;
  local_220 = local_223;
  local_218 = 3;
  std::allocator<unsigned_char>::allocator(&local_224);
  __l_02._M_len = local_218;
  __l_02._M_array = local_220;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_210,__l_02,&local_224);
  binary::binUvarint((binary *)&local_1f8,&local_210);
  std::tie<unsigned_int,int>((uint *)&gtest_ar_6.message_,local_18 + 1);
  std::tuple<unsigned_int&,int&>::operator=
            ((tuple<unsigned_int&,int&> *)&gtest_ar_6.message_,&local_1f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_210);
  std::allocator<unsigned_char>::~allocator(&local_224);
  local_24c = 0xff;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_248,"255","val",&local_24c,(uint *)(local_18 + 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_274 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_270,"2","count",&local_274,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2bb[0] = 0xac;
  local_2bb[1] = 2;
  local_2bb[2] = 7;
  local_2b8 = local_2bb;
  local_2b0 = 3;
  std::allocator<unsigned_char>::allocator(&local_2bc);
  __l_01._M_len = local_2b0;
  __l_01._M_array = local_2b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2a8,__l_01,&local_2bc);
  binary::binUvarint((binary *)&local_290,&local_2a8);
  std::tie<unsigned_int,int>((uint *)&gtest_ar_8.message_,local_18 + 1);
  std::tuple<unsigned_int&,int&>::operator=
            ((tuple<unsigned_int&,int&> *)&gtest_ar_8.message_,&local_290);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2a8);
  std::allocator<unsigned_char>::~allocator(&local_2bc);
  local_2e4 = 300;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_2e0,"300","val",&local_2e4,(uint *)(local_18 + 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_30c = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_308,"2","count",&local_30c,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  local_354[0] = 0x80;
  local_354[1] = 0x80;
  local_354[2] = 1;
  local_354[3] = 7;
  local_350 = local_354;
  local_348 = 4;
  std::allocator<unsigned_char>::allocator(&local_355);
  __l_00._M_len = local_348;
  __l_00._M_array = local_350;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_340,__l_00,&local_355);
  binary::binUvarint((binary *)&local_328,&local_340);
  std::tie<unsigned_int,int>((uint *)&gtest_ar_10.message_,local_18 + 1);
  std::tuple<unsigned_int&,int&>::operator=
            ((tuple<unsigned_int&,int&> *)&gtest_ar_10.message_,&local_328);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_340);
  std::allocator<unsigned_char>::~allocator(&local_355);
  local_37c = 0x4000;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_378,"16384","val",&local_37c,(uint *)(local_18 + 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3a4 = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_3a0,"3","count",&local_3a4,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3d8);
  binary::binUvarint((binary *)&local_3c0,&local_3d8);
  std::tie<unsigned_int,int>((uint *)&gtest_ar_12.message_,local_18 + 1);
  std::tuple<unsigned_int&,int&>::operator=
            ((tuple<unsigned_int&,int&> *)&gtest_ar_12.message_,&local_3c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3d8);
  local_3fc = 0;
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            ((char *)local_3f8,"0",(int *)"val",&local_3fc,local_18 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  local_424 = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_420,"0",(int *)"count",&local_424,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_472[0] = 0x80;
  local_472[1] = 0x80;
  local_472[2] = 0x80;
  local_472[3] = 0x80;
  local_472[4] = 0x80;
  local_472[5] = 0x80;
  local_472[6] = 0x80;
  local_472[7] = 0x80;
  local_472[8] = 0x80;
  local_472[9] = 2;
  local_468 = local_472;
  local_460 = 10;
  std::allocator<unsigned_char>::allocator(&local_473);
  __l._M_len = local_460;
  __l._M_array = local_468;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_458,__l,&local_473);
  binary::binUvarint((binary *)&local_440,&local_458);
  std::tie<unsigned_int,int>((uint *)&gtest_ar_14.message_,local_18 + 1);
  std::tuple<unsigned_int&,int&>::operator=
            ((tuple<unsigned_int&,int&> *)&gtest_ar_14.message_,&local_440);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_458);
  std::allocator<unsigned_char>::~allocator(&local_473);
  local_49c = 0;
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            ((char *)local_498,"0",(int *)"val",&local_49c,local_18 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  local_4c4 = -10;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_4c0,"-10","count",&local_4c4,local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  return;
}

Assistant:

TEST(Binary, DecodeUvarIntFromBinary) {
	multihash::UInt val{};
	int count{};

	// read one byte
	std::tie(val, count) = binary::binUvarint({0b00000001});
	EXPECT_EQ(1, val);
	EXPECT_EQ(1, count);

	std::tie(val, count) = binary::binUvarint({0x11, 0x12, 0x13});
	EXPECT_EQ(0x11, val);
	EXPECT_EQ(1, count);

	// read multiple bytes
	std::tie(val, count) = binary::binUvarint({0b10000000, 0b00000001, 0b00000111});
	EXPECT_EQ(128, val);
	EXPECT_EQ(2, count);

	std::tie(val, count) = binary::binUvarint({0b11111111, 0b00000001, 0b00000111});
	EXPECT_EQ(255, val);
	EXPECT_EQ(2, count);

	std::tie(val, count) = binary::binUvarint({0b10101100, 0b00000010, 0b00000111});
	EXPECT_EQ(300, val);
	EXPECT_EQ(2, count);

	std::tie(val, count) = binary::binUvarint({0b10000000, 0b10000000, 0b00000001, 0b00000111});
	EXPECT_EQ(16384, val);
	EXPECT_EQ(3, count);

	// empty buffer
	std::tie(val, count) = binary::binUvarint({});
	EXPECT_EQ(0, val);
	EXPECT_EQ(0, count);

	// value overflow
	std::tie(val, count) = binary::binUvarint({0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x02});
	EXPECT_EQ(0, val);
	EXPECT_EQ(-10, count);
}